

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O3

CompoundString *
Js::CompoundString::New
          (CharCount stringLength,CharCount directCharLength,void *buffer,CharCount usedCharLength,
          bool reserveMoreSpace,JavascriptLibrary *library)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  CompoundString *this;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  data._32_8_ = buffer;
  if (library == (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x235,"(library)","library");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_68 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_60f7942;
  data.filename._0_4_ = 0x240;
  alloc = Memory::Recycler::TrackAllocInfo(library->recycler,(TrackAllocData *)local_68);
  this = (CompoundString *)new<Memory::Recycler>(0x40,alloc,0x387914);
  CompoundString(this,stringLength,directCharLength,(void *)data._32_8_,usedCharLength,
                 reserveMoreSpace,library);
  return this;
}

Assistant:

CompoundString *CompoundString::New(
        const CharCount stringLength,
        const CharCount directCharLength,
        const void *const buffer,
        const CharCount usedCharLength,
        const bool reserveMoreSpace,
        JavascriptLibrary *const library)
    {
        Assert(library);

        return
            RecyclerNew(
                library->GetRecycler(),
                CompoundString,
                stringLength,
                directCharLength,
                buffer,
                usedCharLength,
                reserveMoreSpace,
                library);
    }